

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O3

REF_STATUS ref_clump_long_edges(REF_GRID_conflict ref_grid,REF_DBL ratio_tol)

{
  REF_INT node0;
  REF_INT node1;
  REF_NODE pRVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  char filename [1024];
  REF_EDGE local_458;
  REF_NODE local_450;
  REF_DBL local_448;
  double local_440;
  char local_438 [1032];
  
  pRVar1 = ref_grid->node;
  local_448 = ratio_tol;
  uVar2 = ref_edge_create(&local_458,ref_grid);
  if (uVar2 == 0) {
    if (0 < local_458->n) {
      lVar6 = 0;
      uVar5 = 0;
      local_450 = pRVar1;
      do {
        if (99 < (int)uVar5) {
          puts("over 100 short edges, giving up");
          break;
        }
        node0 = local_458->e2n[lVar6 * 2];
        node1 = local_458->e2n[lVar6 * 2 + 1];
        uVar2 = ref_node_ratio(local_450,node0,node1,&local_440);
        if (uVar2 != 0) {
          pcVar4 = "ratio";
          uVar3 = 0x211;
          goto LAB_00200acc;
        }
        if (ref_grid->adapt->post_max_ratio * local_448 < local_440) {
          snprintf(local_438,0x400,"clump%d.t",(ulong)uVar5);
          uVar2 = ref_clump_between(ref_grid,node0,node1,local_438);
          if (uVar2 != 0) {
            pcVar4 = "dump";
            uVar3 = 0x214;
            goto LAB_00200acc;
          }
          uVar5 = uVar5 + 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_458->n);
    }
    uVar2 = ref_edge_free(local_458);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar4 = "free edges";
    uVar3 = 0x219;
  }
  else {
    pcVar4 = "orig edges";
    uVar3 = 0x207;
  }
LAB_00200acc:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar3,
         "ref_clump_long_edges",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_clump_long_edges(REF_GRID ref_grid, REF_DBL ratio_tol) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT ntarget;
  REF_INT node0, node1;
  REF_INT edge;
  REF_DBL edge_ratio;

  char filename[1024];

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ntarget = 0;
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (ntarget >= 100) {
      printf("over 100 short edges, giving up\n");
      break;
    }
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    if (edge_ratio > ratio_tol * ref_grid_adapt(ref_grid, post_max_ratio)) {
      snprintf(filename, 1024, "clump%d.t", ntarget);
      RSS(ref_clump_between(ref_grid, node0, node1, filename), "dump");
      ntarget++;
    }
  }

  RSS(ref_edge_free(ref_edge), "free edges");

  return REF_SUCCESS;
}